

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O0

void __thiscall OmegaOP::algo(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  double dVar1;
  size_type sVar2;
  double **ppdVar3;
  double dVar4;
  uint local_60;
  uint local_5c;
  uint u;
  uint t;
  uint v;
  uint T;
  uint temp_indState;
  int temp_chpt;
  double temp_Q;
  double temp_cost;
  uint local_30;
  int iStack_2c;
  Costs cost;
  uint p;
  uint n;
  vector<double,_std::allocator<double>_> *data_local;
  OmegaOP *this_local;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(data);
  iStack_2c = (int)sVar2;
  local_30 = this->nbStates;
  Costs::Costs((Costs *)((long)&temp_cost + 7));
  temp_Q = 0.0;
  _temp_indState = -1.0;
  T = 0xffffffff;
  v = 0;
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  for (t = 2; t < iStack_2c + 1U; t = t + 1) {
    for (u = 0; u < local_30; u = u + 1) {
      _temp_indState = INFINITY;
      v = 0;
      T = 0;
      for (local_5c = 1; local_5c < t; local_5c = local_5c + 1) {
        for (local_60 = 0; local_60 < local_30; local_60 = local_60 + 1) {
          dVar1 = this->Q[local_60][local_5c];
          dVar4 = Costs::slopeCost((Costs *)((long)&temp_cost + 7),this->states + local_60,
                                   this->states + u,&local_5c,&t,*this->S12P + local_5c,
                                   *this->S12P + t,this->S12P[1] + local_5c,this->S12P[1] + t,
                                   this->S12P[2] + local_5c,this->S12P[2] + t);
          temp_Q = dVar1 + dVar4 + this->penalty;
          if (temp_Q < _temp_indState) {
            v = local_60;
            T = local_5c;
            _temp_indState = temp_Q;
          }
        }
      }
      this->Q[u][t] = _temp_indState;
      this->lastChpt[u][t] = T;
      this->lastIndState[u][t] = v;
    }
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaOP::algo(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }

      }
      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }
  pruning = 1;

}